

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O2

void __thiscall
Diligent::FixedBlockMemoryAllocator::MemoryPage::MemoryPage(MemoryPage *this,MemoryPage *Page)

{
  void *pvVar1;
  Uint32 UVar2;
  
  UVar2 = Page->m_NumInitializedBlocks;
  this->m_NumFreeBlocks = Page->m_NumFreeBlocks;
  this->m_NumInitializedBlocks = UVar2;
  pvVar1 = Page->m_pNextFreeBlock;
  this->m_pPageStart = Page->m_pPageStart;
  this->m_pNextFreeBlock = pvVar1;
  this->m_pOwnerAllocator = Page->m_pOwnerAllocator;
  Page->m_pNextFreeBlock = (void *)0x0;
  Page->m_pOwnerAllocator = (FixedBlockMemoryAllocator *)0x0;
  Page->m_NumFreeBlocks = 0;
  Page->m_NumInitializedBlocks = 0;
  Page->m_pPageStart = (void *)0x0;
  return;
}

Assistant:

FixedBlockMemoryAllocator::MemoryPage::MemoryPage(MemoryPage&& Page) noexcept :
    // clang-format off
    m_NumFreeBlocks       {Page.m_NumFreeBlocks       },
    m_NumInitializedBlocks{Page.m_NumInitializedBlocks},
    m_pPageStart          {Page.m_pPageStart          },
    m_pNextFreeBlock      {Page.m_pNextFreeBlock      },
    m_pOwnerAllocator     {Page.m_pOwnerAllocator     }
// clang-format on
{
    Page.m_NumFreeBlocks        = 0;
    Page.m_NumInitializedBlocks = 0;
    Page.m_pPageStart           = nullptr;
    Page.m_pNextFreeBlock       = nullptr;
    Page.m_pOwnerAllocator      = nullptr;
}